

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

int Fra_ClausProcessClausesCut2(Clu_Man_t *p,Fra_Sml_t *pSimMan,Dar_Cut_t *pCut,int *pScores)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint *pSims [16];
  long local_98 [17];
  
  uVar2 = *(uint *)&pCut->field_0x4;
  if (0x5fffffff < uVar2 + 0xc0000000) {
    __assert_fail("pCut->nLeaves > 1 && pCut->nLeaves < 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                  ,0xfe,
                  "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
  }
  iVar7 = pSimMan->nWordsTotal;
  iVar1 = p->nSimWordsPref;
  uVar3 = iVar7 - iVar1;
  if ((uVar3 & 7) == 0) {
    if (0x1fffffff < uVar2) {
      uVar8 = 0;
      do {
        local_98[uVar8] =
             (long)&pSimMan[1].pAig + (long)pCut->pLeaves[uVar8] * (long)iVar7 * 4 + (long)iVar1 * 4
        ;
        uVar8 = uVar8 + 1;
      } while (uVar2 >> 0x1d != uVar8);
    }
    pScores[0xc] = 0;
    pScores[0xd] = 0;
    pScores[0xe] = 0;
    pScores[0xf] = 0;
    pScores[8] = 0;
    pScores[9] = 0;
    pScores[10] = 0;
    pScores[0xb] = 0;
    pScores[4] = 0;
    pScores[5] = 0;
    pScores[6] = 0;
    pScores[7] = 0;
    pScores[0] = 0;
    pScores[1] = 0;
    pScores[2] = 0;
    pScores[3] = 0;
    if (0 < (int)uVar3) {
      uVar8 = 0;
      do {
        iVar7 = 0;
        do {
          if (*(uint *)&pCut->field_0x4 < 0x20000000) {
            lVar5 = 0;
          }
          else {
            uVar4 = 0;
            uVar2 = 0;
            do {
              uVar6 = 1 << ((byte)uVar4 & 0x1f);
              if ((*(uint *)(local_98[uVar4] + uVar8 * 4) & 1 << ((byte)iVar7 & 0x1f)) == 0) {
                uVar6 = 0;
              }
              uVar2 = uVar2 | uVar6;
              uVar4 = uVar4 + 1;
            } while (*(uint *)&pCut->field_0x4 >> 0x1d != uVar4);
            lVar5 = (long)(int)uVar2;
          }
          pScores[lVar5] = pScores[lVar5] + 1;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0x20);
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar3);
    }
    lVar5 = 0;
    uVar2 = 0;
    do {
      uVar3 = 1 << ((byte)lVar5 & 0x1f);
      if (pScores[lVar5] == 0) {
        uVar3 = 0;
      }
      uVar2 = uVar2 | uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    return uVar2;
  }
  __assert_fail("nWordsForSim % 8 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClaus.c"
                ,0xff,
                "int Fra_ClausProcessClausesCut2(Clu_Man_t *, Fra_Sml_t *, Dar_Cut_t *, int *)");
}

Assistant:

int Fra_ClausProcessClausesCut2( Clu_Man_t * p, Fra_Sml_t * pSimMan, Dar_Cut_t * pCut, int * pScores )
{
    unsigned * pSims[16], uWord;
    int iMint, i, k, b;
    int nWordsForSim = pSimMan->nWordsTotal - p->nSimWordsPref;
    // compute parameters
    assert( pCut->nLeaves > 1 && pCut->nLeaves < 5 );
    assert( nWordsForSim % 8 == 0 );
    // get parameters
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pSims[i] = Fra_ObjSim( pSimMan, pCut->pLeaves[i] ) + p->nSimWordsPref;
    // add combinational patterns
    memset( pScores, 0, sizeof(int) * 16 );
    for ( i = 0; i < nWordsForSim; i++ )
        for ( k = 0; k < 32; k++ )
        {
            iMint = 0;
            for ( b = 0; b < (int)pCut->nLeaves; b++ )
                if ( pSims[b][i] & (1 << k) )
                    iMint |= (1 << b);
            pScores[iMint]++;
        }
    // collect patterns
    uWord = 0;
    for ( i = 0; i < 16; i++ )
        if ( pScores[i] )
            uWord |= (1 << i);
//    Extra_PrintBinary( stdout, &uWord, 16 ); printf( "\n" );
    return (int)uWord;
}